

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O3

void __thiscall chrono::ChAssembly::SetupInitial(ChAssembly *this)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  pointer psVar4;
  pointer psVar5;
  long lVar6;
  ulong uVar7;
  
  psVar1 = (this->bodylist).
           super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->bodylist).
      super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar1) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      (**(code **)(**(long **)((long)&(psVar1->
                                      super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr + lVar6) + 0x1d8))();
      psVar1 = (this->bodylist).
               super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < (ulong)((long)(this->bodylist).
                                   super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4));
  }
  psVar2 = (this->shaftlist).
           super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->shaftlist).
      super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar2) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      (**(code **)(**(long **)((long)&(psVar2->
                                      super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr + lVar6) + 0x1d8))();
      psVar2 = (this->shaftlist).
               super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < (ulong)((long)(this->shaftlist).
                                   super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4));
  }
  psVar3 = (this->linklist).
           super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->linklist).
      super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar3) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      (**(code **)(**(long **)((long)&(psVar3->
                                      super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr + lVar6) + 0x1d8))();
      psVar3 = (this->linklist).
               super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < (ulong)((long)(this->linklist).
                                   super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4));
  }
  psVar4 = (this->meshlist).
           super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->meshlist).
      super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar4) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      (**(code **)(**(long **)((long)&(psVar4->
                                      super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr + lVar6) + 0x1d8))();
      psVar4 = (this->meshlist).
               super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < (ulong)((long)(this->meshlist).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4));
  }
  psVar5 = (this->otherphysicslist).
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->otherphysicslist).
      super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar5) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      (**(code **)(**(long **)((long)&(psVar5->
                                      super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr + lVar6) + 0x1d8))();
      psVar5 = (this->otherphysicslist).
               super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < (ulong)((long)(this->otherphysicslist).
                                   super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4));
  }
  return;
}

Assistant:

void ChAssembly::SetupInitial() {
    for (int ip = 0; ip < bodylist.size(); ++ip) {
        bodylist[ip]->SetupInitial();
    }
    for (int ip = 0; ip < shaftlist.size(); ++ip) {
        shaftlist[ip]->SetupInitial();
    }
    for (int ip = 0; ip < linklist.size(); ++ip) {
        linklist[ip]->SetupInitial();
    }
    for (int ip = 0; ip < meshlist.size(); ++ip) {
        meshlist[ip]->SetupInitial();
    }
    for (int ip = 0; ip < otherphysicslist.size(); ++ip) {
        otherphysicslist[ip]->SetupInitial();
    }
}